

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

cio_address_family cio_socket_get_address_family(cio_socket *socket)

{
  int iVar1;
  cio_address_family cVar2;
  socklen_t sock_addr_size;
  sockaddr_storage sock_addr;
  socklen_t local_8c;
  sockaddr local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88.sa_family = 0;
  local_88.sa_data[0] = '\0';
  local_88.sa_data[1] = '\0';
  local_88.sa_data[2] = '\0';
  local_88.sa_data[3] = '\0';
  local_88.sa_data[4] = '\0';
  local_88.sa_data[5] = '\0';
  local_88.sa_data[6] = '\0';
  local_88.sa_data[7] = '\0';
  local_88.sa_data[8] = '\0';
  local_88.sa_data[9] = '\0';
  local_88.sa_data[10] = '\0';
  local_88.sa_data[0xb] = '\0';
  local_88.sa_data[0xc] = '\0';
  local_88.sa_data[0xd] = '\0';
  local_8c = 0x80;
  iVar1 = getsockname((socket->impl).ev.fd,&local_88,&local_8c);
  cVar2 = (cio_address_family)local_88.sa_family;
  if (iVar1 < 0) {
    cVar2 = CIO_ADDRESS_FAMILY_UNSPEC;
  }
  return cVar2;
}

Assistant:

enum cio_address_family cio_socket_get_address_family(const struct cio_socket *socket)
{
	struct sockaddr_storage sock_addr;
	memset(&sock_addr, 0, sizeof(sock_addr));
	socklen_t sock_addr_size = sizeof(sock_addr);

	if (getsockname(socket->impl.ev.fd, (struct sockaddr *)&sock_addr, &sock_addr_size) < 0) {
		return CIO_ADDRESS_FAMILY_UNSPEC;
	}

	return (enum cio_address_family)sock_addr.ss_family;
}